

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_block_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LocalSingleBlockLoadStoreElimPass::InitExtensions
          (LocalSingleBlockLoadStoreElimPass *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_868;
  allocator<char> local_860;
  allocator<char> local_85f;
  allocator<char> local_85e;
  allocator<char> local_85d;
  allocator<char> local_85c;
  allocator<char> local_85b;
  allocator<char> local_85a;
  allocator<char> local_859;
  allocator<char> local_858;
  allocator<char> local_857;
  allocator<char> local_856;
  allocator<char> local_855;
  allocator<char> local_854;
  allocator<char> local_853;
  allocator<char> local_852;
  allocator<char> local_851;
  allocator<char> local_850;
  allocator<char> local_84f;
  allocator<char> local_84e;
  allocator<char> local_84d;
  allocator<char> local_84c;
  allocator<char> local_84b;
  allocator<char> local_84a;
  allocator<char> local_849;
  allocator<char> local_848;
  allocator<char> local_847;
  allocator<char> local_846;
  allocator<char> local_845;
  allocator<char> local_844;
  allocator<char> local_843;
  allocator<char> local_842;
  allocator<char> local_841;
  allocator<char> local_840;
  allocator<char> local_83f;
  allocator<char> local_83e;
  allocator<char> local_83d;
  allocator<char> local_83c;
  allocator<char> local_83b;
  allocator<char> local_83a;
  allocator<char> local_839;
  allocator<char> local_838;
  allocator<char> local_837;
  allocator<char> local_836;
  allocator<char> local_835;
  allocator<char> local_834;
  allocator<char> local_833;
  allocator<char> local_832;
  allocator<char> local_831;
  allocator<char> local_830;
  allocator<char> local_82f;
  allocator<char> local_82e;
  allocator<char> local_82d;
  allocator<char> local_82c;
  allocator<char> local_82b;
  allocator<char> local_82a;
  allocator<char> local_829;
  allocator<char> local_828;
  allocator<char> local_827;
  allocator<char> local_826;
  allocator<char> local_825;
  allocator<char> local_824;
  allocator<char> local_823;
  allocator<char> local_822;
  allocator<char> local_821;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  string asStack_800 [32];
  string asStack_7e0 [32];
  string asStack_7c0 [32];
  string asStack_7a0 [32];
  string asStack_780 [32];
  string asStack_760 [32];
  string asStack_740 [32];
  string asStack_720 [32];
  string asStack_700 [32];
  string asStack_6e0 [32];
  string asStack_6c0 [32];
  string asStack_6a0 [32];
  string asStack_680 [32];
  string asStack_660 [32];
  string asStack_640 [32];
  string asStack_620 [32];
  string asStack_600 [32];
  string asStack_5e0 [32];
  string asStack_5c0 [32];
  string asStack_5a0 [32];
  string asStack_580 [32];
  string asStack_560 [32];
  string asStack_540 [32];
  string asStack_520 [32];
  string asStack_500 [32];
  string asStack_4e0 [32];
  string asStack_4c0 [32];
  string asStack_4a0 [32];
  string asStack_480 [32];
  string asStack_460 [32];
  string asStack_440 [32];
  string asStack_420 [32];
  string asStack_400 [32];
  string asStack_3e0 [32];
  string asStack_3c0 [32];
  string asStack_3a0 [32];
  string asStack_380 [32];
  string asStack_360 [32];
  string asStack_340 [32];
  string asStack_320 [32];
  string asStack_300 [32];
  string asStack_2e0 [32];
  string asStack_2c0 [32];
  string asStack_2a0 [32];
  string asStack_280 [32];
  string asStack_260 [32];
  string asStack_240 [32];
  string asStack_220 [32];
  string asStack_200 [32];
  string asStack_1e0 [32];
  string asStack_1c0 [32];
  string asStack_1a0 [32];
  string asStack_180 [32];
  string asStack_160 [32];
  string asStack_140 [32];
  string asStack_120 [32];
  string asStack_100 [32];
  string asStack_e0 [32];
  string asStack_c0 [32];
  string asStack_a0 [32];
  string asStack_80 [32];
  string asStack_60 [32];
  string asStack_40 [32];
  iterator local_20;
  size_type local_18;
  undefined1 local_10 [8];
  LocalSingleBlockLoadStoreElimPass *this_local;
  
  local_10 = (undefined1  [8])this;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->extensions_allowlist_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_820,"SPV_AMD_shader_explicit_vertex_parameter",&local_821);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_800,"SPV_AMD_shader_trinary_minmax",&local_822);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_7e0,"SPV_AMD_gcn_shader",&local_823);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_7c0,"SPV_KHR_shader_ballot",&local_824)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_7a0,"SPV_AMD_shader_ballot",&local_825)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_780,"SPV_AMDX_shader_enqueue",&local_826);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_760,"SPV_AMD_gpu_shader_half_float",&local_827);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_740,"SPV_KHR_shader_draw_parameters",&local_828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_720,"SPV_KHR_subgroup_vote",&local_829)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_700,"SPV_KHR_8bit_storage",&local_82a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_6e0,"SPV_KHR_16bit_storage",&local_82b)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_6c0,"SPV_KHR_device_group",&local_82c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_6a0,"SPV_KHR_multiview",&local_82d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_680,"SPV_NVX_multiview_per_view_attributes",&local_82e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_660,"SPV_NV_viewport_array2",&local_82f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_640,"SPV_NV_stereo_view_rendering",&local_830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_620,"SPV_NV_sample_mask_override_coverage",&local_831);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_600,"SPV_NV_geometry_shader_passthrough",&local_832);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_5e0,"SPV_AMD_texture_gather_bias_lod",&local_833);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_5c0,"SPV_KHR_storage_buffer_storage_class",&local_834);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_5a0,"SPV_KHR_variable_pointers",&local_835);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_580,"SPV_AMD_gpu_shader_int16",&local_836);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_560,"SPV_KHR_post_depth_coverage",&local_837);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_540,"SPV_KHR_shader_atomic_counter_ops",&local_838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_520,"SPV_EXT_shader_stencil_export",&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_500,"SPV_EXT_shader_viewport_index_layer",&local_83a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_4e0,"SPV_AMD_shader_image_load_store_lod",&local_83b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_4c0,"SPV_AMD_shader_fragment_mask",&local_83c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_4a0,"SPV_EXT_fragment_fully_covered",&local_83d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_480,"SPV_AMD_gpu_shader_half_float_fetch",&local_83e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_460,"SPV_GOOGLE_decorate_string",&local_83f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_440,"SPV_GOOGLE_hlsl_functionality1",&local_840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_420,"SPV_GOOGLE_user_type",&local_841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_400,"SPV_NV_shader_subgroup_partitioned",&local_842);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_3e0,"SPV_EXT_demote_to_helper_invocation",&local_843);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_3c0,"SPV_EXT_descriptor_indexing",&local_844);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_3a0,"SPV_NV_fragment_shader_barycentric",&local_845);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_380,"SPV_NV_compute_shader_derivatives",&local_846);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_360,"SPV_NV_shader_image_footprint",&local_847);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_340,"SPV_NV_shading_rate",&local_848);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_320,"SPV_NV_mesh_shader",&local_849);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_300,"SPV_EXT_mesh_shader",&local_84a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_2e0,"SPV_NV_ray_tracing",&local_84b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_2c0,"SPV_KHR_ray_tracing",&local_84c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_2a0,"SPV_KHR_ray_query",&local_84d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_280,"SPV_EXT_fragment_invocation_density",&local_84e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_260,"SPV_EXT_physical_storage_buffer",&local_84f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_240,"SPV_KHR_physical_storage_buffer",&local_850);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_220,"SPV_KHR_terminate_invocation",&local_851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_200,"SPV_KHR_subgroup_uniform_control_flow",&local_852);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_1e0,"SPV_KHR_integer_dot_product",&local_853);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_1c0,"SPV_EXT_shader_image_int64",&local_854);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_1a0,"SPV_KHR_non_semantic_info",&local_855);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_180,"SPV_KHR_uniform_group_instructions",&local_856);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_160,"SPV_KHR_fragment_shader_barycentric",&local_857);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_140,"SPV_KHR_vulkan_memory_model",&local_858);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_120,"SPV_NV_bindless_texture",&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_100,"SPV_EXT_shader_atomic_float_add",&local_85a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_e0,"SPV_EXT_fragment_shader_interlock",&local_85b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_c0,"SPV_KHR_compute_shader_derivatives",&local_85c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_a0,"SPV_NV_cooperative_matrix",&local_85d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_80,"SPV_KHR_cooperative_matrix",&local_85e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_60,"SPV_KHR_ray_tracing_position_fetch",&local_85f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_40,"SPV_KHR_fragment_shading_rate",&local_860);
  local_20 = &local_820;
  local_18 = 0x40;
  __l._M_len = 0x40;
  __l._M_array = local_20;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&this->extensions_allowlist_,__l);
  local_868 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_868 = local_868 + -1;
    std::__cxx11::string::~string((string *)local_868);
  } while (local_868 != &local_820);
  std::allocator<char>::~allocator(&local_860);
  std::allocator<char>::~allocator(&local_85f);
  std::allocator<char>::~allocator(&local_85e);
  std::allocator<char>::~allocator(&local_85d);
  std::allocator<char>::~allocator(&local_85c);
  std::allocator<char>::~allocator(&local_85b);
  std::allocator<char>::~allocator(&local_85a);
  std::allocator<char>::~allocator(&local_859);
  std::allocator<char>::~allocator(&local_858);
  std::allocator<char>::~allocator(&local_857);
  std::allocator<char>::~allocator(&local_856);
  std::allocator<char>::~allocator(&local_855);
  std::allocator<char>::~allocator(&local_854);
  std::allocator<char>::~allocator(&local_853);
  std::allocator<char>::~allocator(&local_852);
  std::allocator<char>::~allocator(&local_851);
  std::allocator<char>::~allocator(&local_850);
  std::allocator<char>::~allocator(&local_84f);
  std::allocator<char>::~allocator(&local_84e);
  std::allocator<char>::~allocator(&local_84d);
  std::allocator<char>::~allocator(&local_84c);
  std::allocator<char>::~allocator(&local_84b);
  std::allocator<char>::~allocator(&local_84a);
  std::allocator<char>::~allocator(&local_849);
  std::allocator<char>::~allocator(&local_848);
  std::allocator<char>::~allocator(&local_847);
  std::allocator<char>::~allocator(&local_846);
  std::allocator<char>::~allocator(&local_845);
  std::allocator<char>::~allocator(&local_844);
  std::allocator<char>::~allocator(&local_843);
  std::allocator<char>::~allocator(&local_842);
  std::allocator<char>::~allocator(&local_841);
  std::allocator<char>::~allocator(&local_840);
  std::allocator<char>::~allocator(&local_83f);
  std::allocator<char>::~allocator(&local_83e);
  std::allocator<char>::~allocator(&local_83d);
  std::allocator<char>::~allocator(&local_83c);
  std::allocator<char>::~allocator(&local_83b);
  std::allocator<char>::~allocator(&local_83a);
  std::allocator<char>::~allocator(&local_839);
  std::allocator<char>::~allocator(&local_838);
  std::allocator<char>::~allocator(&local_837);
  std::allocator<char>::~allocator(&local_836);
  std::allocator<char>::~allocator(&local_835);
  std::allocator<char>::~allocator(&local_834);
  std::allocator<char>::~allocator(&local_833);
  std::allocator<char>::~allocator(&local_832);
  std::allocator<char>::~allocator(&local_831);
  std::allocator<char>::~allocator(&local_830);
  std::allocator<char>::~allocator(&local_82f);
  std::allocator<char>::~allocator(&local_82e);
  std::allocator<char>::~allocator(&local_82d);
  std::allocator<char>::~allocator(&local_82c);
  std::allocator<char>::~allocator(&local_82b);
  std::allocator<char>::~allocator(&local_82a);
  std::allocator<char>::~allocator(&local_829);
  std::allocator<char>::~allocator(&local_828);
  std::allocator<char>::~allocator(&local_827);
  std::allocator<char>::~allocator(&local_826);
  std::allocator<char>::~allocator(&local_825);
  std::allocator<char>::~allocator(&local_824);
  std::allocator<char>::~allocator(&local_823);
  std::allocator<char>::~allocator(&local_822);
  std::allocator<char>::~allocator(&local_821);
  return;
}

Assistant:

void LocalSingleBlockLoadStoreElimPass::InitExtensions() {
  extensions_allowlist_.clear();
  extensions_allowlist_.insert({"SPV_AMD_shader_explicit_vertex_parameter",
                                "SPV_AMD_shader_trinary_minmax",
                                "SPV_AMD_gcn_shader",
                                "SPV_KHR_shader_ballot",
                                "SPV_AMD_shader_ballot",
                                "SPV_AMDX_shader_enqueue",
                                "SPV_AMD_gpu_shader_half_float",
                                "SPV_KHR_shader_draw_parameters",
                                "SPV_KHR_subgroup_vote",
                                "SPV_KHR_8bit_storage",
                                "SPV_KHR_16bit_storage",
                                "SPV_KHR_device_group",
                                "SPV_KHR_multiview",
                                "SPV_NVX_multiview_per_view_attributes",
                                "SPV_NV_viewport_array2",
                                "SPV_NV_stereo_view_rendering",
                                "SPV_NV_sample_mask_override_coverage",
                                "SPV_NV_geometry_shader_passthrough",
                                "SPV_AMD_texture_gather_bias_lod",
                                "SPV_KHR_storage_buffer_storage_class",
                                "SPV_KHR_variable_pointers",
                                "SPV_AMD_gpu_shader_int16",
                                "SPV_KHR_post_depth_coverage",
                                "SPV_KHR_shader_atomic_counter_ops",
                                "SPV_EXT_shader_stencil_export",
                                "SPV_EXT_shader_viewport_index_layer",
                                "SPV_AMD_shader_image_load_store_lod",
                                "SPV_AMD_shader_fragment_mask",
                                "SPV_EXT_fragment_fully_covered",
                                "SPV_AMD_gpu_shader_half_float_fetch",
                                "SPV_GOOGLE_decorate_string",
                                "SPV_GOOGLE_hlsl_functionality1",
                                "SPV_GOOGLE_user_type",
                                "SPV_NV_shader_subgroup_partitioned",
                                "SPV_EXT_demote_to_helper_invocation",
                                "SPV_EXT_descriptor_indexing",
                                "SPV_NV_fragment_shader_barycentric",
                                "SPV_NV_compute_shader_derivatives",
                                "SPV_NV_shader_image_footprint",
                                "SPV_NV_shading_rate",
                                "SPV_NV_mesh_shader",
                                "SPV_EXT_mesh_shader",
                                "SPV_NV_ray_tracing",
                                "SPV_KHR_ray_tracing",
                                "SPV_KHR_ray_query",
                                "SPV_EXT_fragment_invocation_density",
                                "SPV_EXT_physical_storage_buffer",
                                "SPV_KHR_physical_storage_buffer",
                                "SPV_KHR_terminate_invocation",
                                "SPV_KHR_subgroup_uniform_control_flow",
                                "SPV_KHR_integer_dot_product",
                                "SPV_EXT_shader_image_int64",
                                "SPV_KHR_non_semantic_info",
                                "SPV_KHR_uniform_group_instructions",
                                "SPV_KHR_fragment_shader_barycentric",
                                "SPV_KHR_vulkan_memory_model",
                                "SPV_NV_bindless_texture",
                                "SPV_EXT_shader_atomic_float_add",
                                "SPV_EXT_fragment_shader_interlock",
                                "SPV_KHR_compute_shader_derivatives",
                                "SPV_NV_cooperative_matrix",
                                "SPV_KHR_cooperative_matrix",
                                "SPV_KHR_ray_tracing_position_fetch",
                                "SPV_KHR_fragment_shading_rate"});
}